

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytesinkutil.cpp
# Opt level: O1

void icu_63::ByteSinkUtil::appendCodePoint(int32_t length,UChar32 c,ByteSink *sink,Edits *edits)

{
  undefined8 in_RAX;
  uint uVar1;
  uint uVar2;
  char s8 [4];
  undefined8 uStack_18;
  
  uStack_18._5_3_ = (undefined3)((ulong)in_RAX >> 0x28);
  uStack_18._0_4_ = (undefined4)in_RAX;
  if ((uint)c < 0x80) {
    uStack_18._0_5_ = CONCAT14((byte)c,(undefined4)uStack_18);
    uVar2 = 1;
  }
  else {
    if ((uint)c < 0x800) {
      uStack_18 = CONCAT35(uStack_18._5_3_,CONCAT14((char)((uint)c >> 6),(undefined4)uStack_18)) |
                  0xc000000000;
      uVar1 = 1;
    }
    else {
      if ((uint)c < 0x10000) {
        uStack_18 = CONCAT35(uStack_18._5_3_,CONCAT14((char)((uint)c >> 0xc),(undefined4)uStack_18))
                    | 0xe000000000;
        uVar2 = 1;
      }
      else {
        uStack_18._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
        uStack_18 = CONCAT26(uStack_18._6_2_,
                             CONCAT15((char)((uint)c >> 0xc),
                                      CONCAT14((char)((uint)c >> 0x12),(undefined4)uStack_18))) &
                    0xffff3fffffffffff | 0x80f000000000;
        uVar2 = 2;
      }
      uVar1 = uVar2 + 1;
      *(byte *)((long)&uStack_18 + (ulong)uVar2 + 4) = (byte)((uint)c >> 6) & 0x3f | 0x80;
    }
    uVar2 = uVar1 + 1;
    *(byte *)((long)&uStack_18 + (ulong)uVar1 + 4) = (byte)c & 0x3f | 0x80;
  }
  if (edits != (Edits *)0x0) {
    Edits::addReplace(edits,length,uVar2);
  }
  (*sink->_vptr_ByteSink[2])(sink,(long)&uStack_18 + 4,(ulong)uVar2);
  return;
}

Assistant:

void
ByteSinkUtil::appendCodePoint(int32_t length, UChar32 c, ByteSink &sink, Edits *edits) {
    char s8[U8_MAX_LENGTH];
    int32_t s8Length = 0;
    U8_APPEND_UNSAFE(s8, s8Length, c);
    if (edits != nullptr) {
        edits->addReplace(length, s8Length);
    }
    sink.Append(s8, s8Length);
}